

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Error * ot::commissioner::Interpreter::GetJoinerType
                  (Error *__return_storage_ptr__,JoinerType *aType,string *aStr)

{
  pointer *ppcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  char *pcVar5;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  string_view fmt;
  format_args args;
  string local_b8;
  JoinerType *local_98;
  undefined1 local_90 [8];
  char *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  format_string_checker<char> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_38 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98 = aType;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"meshcop","");
  utils::ToLower((string *)&local_68,aStr);
  utils::ToLower((string *)local_90,&local_b8);
  uVar3 = local_90._4_4_;
  uVar2 = local_90._0_4_;
  if (local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ == local_88) {
    if (local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ == (char *)0x0) {
      bVar6 = true;
    }
    else {
      iVar4 = bcmp((void *)local_68._0_8_,(void *)CONCAT44(local_90._4_4_,local_90._0_4_),
                   (size_t)local_68.context_.super_basic_format_parse_context<char>.format_str_.
                           data_);
      bVar6 = iVar4 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if ((undefined1 *)CONCAT44(uVar3,uVar2) != local_80) {
    operator_delete((undefined1 *)CONCAT44(uVar3,uVar2));
  }
  ppcVar1 = (pointer *)&local_68.context_.super_basic_format_parse_context<char>.format_str_.size_;
  if ((pointer *)local_68._0_8_ != ppcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (bVar6) {
    *local_98 = kMeshCoP;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ae","");
    utils::ToLower((string *)&local_68,aStr);
    utils::ToLower((string *)local_90,&local_b8);
    uVar3 = local_90._4_4_;
    uVar2 = local_90._0_4_;
    if (local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ == local_88) {
      if (local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ == (char *)0x0)
      {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp((void *)local_68._0_8_,(void *)CONCAT44(local_90._4_4_,local_90._0_4_),
                     (size_t)local_68.context_.super_basic_format_parse_context<char>.format_str_.
                             data_);
        bVar6 = iVar4 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((undefined1 *)CONCAT44(uVar3,uVar2) != local_80) {
      operator_delete((undefined1 *)CONCAT44(uVar3,uVar2));
    }
    if ((pointer *)local_68._0_8_ != ppcVar1) {
      operator_delete((void *)local_68._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (bVar6) {
      *local_98 = kAE;
    }
    else {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"nmkp","");
      utils::ToLower((string *)&local_68,aStr);
      utils::ToLower((string *)local_90,&local_b8);
      if (local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ == local_88) {
        if (local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ ==
            (char *)0x0) {
          bVar6 = true;
        }
        else {
          iVar4 = bcmp((void *)local_68._0_8_,(void *)CONCAT44(local_90._4_4_,local_90._0_4_),
                       (size_t)local_68.context_.super_basic_format_parse_context<char>.format_str_.
                               data_);
          bVar6 = iVar4 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((undefined1 *)CONCAT44(local_90._4_4_,local_90._0_4_) != local_80) {
        operator_delete((undefined1 *)CONCAT44(local_90._4_4_,local_90._0_4_));
      }
      if ((pointer *)local_68._0_8_ != ppcVar1) {
        operator_delete((void *)local_68._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (bVar6) {
        *local_98 = kNMKP;
      }
      else {
        local_68.types_[0] = 0xd;
        local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "{} is not a valid joiner type";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1d;
        local_68.context_.super_basic_format_parse_context<char>._16_8_ = 0x100000000;
        local_68.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        begin = "{} is not a valid joiner type";
        local_68.context_.types_ = local_68.types_;
        do {
          pcVar5 = begin + 1;
          if (*begin == '}') {
            if ((pcVar5 == "") || (*pcVar5 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar5 = begin + 2;
          }
          else if (*begin == '{') {
            pcVar5 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (begin,"",&local_68);
          }
          begin = pcVar5;
        } while (pcVar5 != "");
        local_68._0_8_ = (aStr->_M_dataplus)._M_p;
        local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             (char *)aStr->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1d;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_68;
        ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)"{} is not a valid joiner type",fmt,args);
        local_90._0_4_ = kInvalidArgs;
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
        __return_storage_ptr__->mCode = local_90._0_4_;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->mMessage,(string *)&local_88);
        if (local_88 != local_78) {
          operator_delete(local_88);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::GetJoinerType(JoinerType &aType, const std::string &aStr)
{
    Error error;

    if (CaseInsensitiveEqual(aStr, "meshcop"))
    {
        aType = JoinerType::kMeshCoP;
    }
    else if (CaseInsensitiveEqual(aStr, "ae"))
    {
        aType = JoinerType::kAE;
    }
    else if (CaseInsensitiveEqual(aStr, "nmkp"))
    {
        aType = JoinerType::kNMKP;
    }
    else
    {
        error = ERROR_INVALID_ARGS("{} is not a valid joiner type", aStr);
    }

    return error;
}